

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_dump.h
# Opt level: O3

void dumpTokenArray(KonohaContext *kctx,int nest,kArray *a,int s,int e)

{
  kToken *tk;
  _func_int_char_ptr_varargs *p_Var1;
  kString *pkVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  
  if (verbose_sugar != 0) {
    if (nest == 0) {
      (*kctx->platApi->printf_i)(">>>\n");
    }
    if (s < e) {
      lVar5 = (long)s;
      do {
        tk = (kToken *)(a->field_2).unboxItems[lVar5];
        iVar4 = nest;
        if (0 < nest) {
          do {
            (*kctx->platApi->printf_i)("  ");
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        dumpToken(kctx,tk,(int)lVar5);
        pkVar2 = (tk->field_2).text;
        if (((pkVar2->h).ct)->baseTypeId == 6) {
          iVar4 = nest;
          if (0 < nest) {
            do {
              (*kctx->platApi->printf_i)("  ");
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
            pkVar2 = (tk->field_2).text;
          }
          p_Var1 = kctx->platApi->printf_i;
          uVar3 = (**(code **)(*(long *)(*(long *)(*(long *)(pkVar2->field_2).byteptr + 0x20) + 8) +
                              0x20))(kctx);
          (*p_Var1)("%s\n",uVar3);
          dumpTokenArray(kctx,nest + 1,(tk->field_2).GroupTokenList,1,
                         (int)(((tk->field_2).GroupTokenList)->bytesize >> 3) + -1);
          iVar4 = nest;
          if (0 < nest) {
            do {
              (*kctx->platApi->printf_i)("  ");
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          p_Var1 = kctx->platApi->printf_i;
          uVar3 = (**(code **)(*(long *)(*(long *)(*(long *)((((tk->field_2).text)->field_2).byteptr
                                                            + ((((tk->field_2).text)->bytesize &
                                                               0xfffffffffffffff8) - 8)) + 0x20) + 8
                                        ) + 0x20))(kctx);
          (*p_Var1)("%s\n",uVar3);
        }
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != e);
    }
    if (nest == 0) {
      (*kctx->platApi->printf_i)("<<<\n");
      return;
    }
  }
  return;
}

Assistant:

static void dumpTokenArray(KonohaContext *kctx, int nest, kArray *a, int s, int e)
{
	if(verbose_sugar) {
		if(nest == 0) DUMP_P(">>>\n");
		while(s < e) {
			kToken *tk = a->TokenItems[s];
			dumpIndent(kctx, nest);
			dumpToken(kctx, tk, s);
			if(IS_Array(tk->GroupTokenList)) {
				dumpIndent(kctx, nest);
				DUMP_P("%s\n", kString_text(tk->GroupTokenList->TokenItems[0]->text));
				dumpTokenArray(kctx, nest+1, RangeGroup(tk->GroupTokenList));
				dumpIndent(kctx, nest);
				DUMP_P("%s\n", kString_text(tk->GroupTokenList->TokenItems[kArray_size(tk->GroupTokenList)-1]->text));
			}
			s++;
		}
		if(nest == 0) DUMP_P("<<<\n");
	}
}